

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::UnsupportedChunk_Binary
          (COBImporter *this,StreamReaderLE *reader,ChunkInfo *nfo,char *name)

{
  ostream *poVar1;
  Logger *this_00;
  uint *s;
  string error;
  string local_1b8;
  ostream local_198 [376];
  
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[32]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             (char (*) [32])"Encountered unsupported chunk: ");
  std::operator<<(local_198,name);
  std::operator<<(local_198," [version: ");
  poVar1 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_198
                      ,&nfo->version);
  std::operator<<(poVar1,", size: ");
  s = &nfo->size;
  poVar1 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)poVar1,s)
  ;
  std::operator<<(poVar1,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  if (*s != 0xffffffff) {
    this_00 = DefaultLogger::get();
    Logger::error(this_00,local_1b8._M_dataplus._M_p);
    StreamReader<false,_false>::IncPtr(reader,(ulong)*s);
    std::__cxx11::string::~string((string *)&local_1b8);
    return;
  }
  ThrowException(&local_1b8);
}

Assistant:

void COBImporter::UnsupportedChunk_Binary( StreamReaderLE& reader, const ChunkInfo& nfo, const char* name)
{
    const std::string error = format("Encountered unsupported chunk: ") <<  name <<
        " [version: "<<nfo.version<<", size: "<<nfo.size<<"]";

    // we can recover if the chunk size was specified.
    if(nfo.size != static_cast<unsigned int>(-1)) {
        ASSIMP_LOG_ERROR(error);
        reader.IncPtr(nfo.size);
    }
    else ThrowException(error);
}